

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void randomBlob(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  void *pBuf;
  uchar *p;
  sqlite3_int64 n;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  p = (uchar *)sqlite3_value_int64(*argv);
  if ((long)p < 1) {
    p = &DAT_00000001;
  }
  pBuf = contextMalloc(context,(i64)p);
  if (pBuf != (void *)0x0) {
    sqlite3_randomness((int)p,pBuf);
    sqlite3_result_blob(context,pBuf,(int)p,sqlite3_free);
  }
  return;
}

Assistant:

static void randomBlob(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  sqlite3_int64 n;
  unsigned char *p;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  n = sqlite3_value_int64(argv[0]);
  if( n<1 ){
    n = 1;
  }
  p = contextMalloc(context, n);
  if( p ){
    sqlite3_randomness(n, p);
    sqlite3_result_blob(context, (char*)p, n, sqlite3_free);
  }
}